

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

void sect_NewSection(char *name,SectionType type,uint32_t org,SectionSpec *attribs,
                    SectionModifier mod)

{
  int iVar1;
  Section *pSVar2;
  SectionStackEntry *pSVar3;
  
  pSVar3 = sectionStack;
  if (currentLoadSection != (Section *)0x0) {
    fatalerror("Cannot change the section within a `LOAD` block\n");
  }
  while( true ) {
    if (pSVar3 == (SectionStackEntry *)0x0) {
      pSVar2 = getSection(name,type,org,attribs,mod);
      changeSection();
      curOffset = 0;
      if (mod != SECTION_UNION) {
        curOffset = pSVar2->size;
      }
      loadOffset = 0;
      currentSection = pSVar2;
      return;
    }
    if ((pSVar3->section != (Section *)0x0) &&
       (iVar1 = strcmp(name,pSVar3->section->name), iVar1 == 0)) break;
    pSVar3 = pSVar3->next;
  }
  fatalerror("Section \'%s\' is already on the stack\n",name);
}

Assistant:

void sect_NewSection(char const *name, enum SectionType type, uint32_t org,
		     struct SectionSpec const *attribs, enum SectionModifier mod)
{
	if (currentLoadSection)
		fatalerror("Cannot change the section within a `LOAD` block\n");

	for (struct SectionStackEntry *stack = sectionStack; stack; stack = stack->next) {
		if (stack->section && !strcmp(name, stack->section->name))
			fatalerror("Section '%s' is already on the stack\n", name);
	}

	struct Section *sect = getSection(name, type, org, attribs, mod);

	changeSection();
	curOffset = mod == SECTION_UNION ? 0 : sect->size;
	loadOffset = 0; // This is still used when checking for section size overflow!
	currentSection = sect;
}